

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::GetTargetLinkFlags
          (cmMakefileTargetGenerator *this,string *flags,string *linkLanguage)

{
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  string *psVar2;
  char *pcVar3;
  undefined1 local_b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string linkFlagsConfig;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *linkLanguage_local;
  string *flags_local;
  cmMakefileTargetGenerator *this_local;
  
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar1 = this->LocalGenerator;
  local_20 = linkLanguage;
  linkLanguage_local = flags;
  flags_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"LINK_FLAGS",&local_41);
  pcVar3 = cmGeneratorTarget::GetProperty(this_00,&local_40);
  (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
            (pcVar1,flags,pcVar3);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"LINK_FLAGS_",&local_79);
  std::allocator<char>::~allocator(&local_79);
  cmsys::SystemTools::UpperCase
            ((string *)
             &opts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &(this->super_cmCommonTargetGenerator).ConfigName);
  std::__cxx11::string::operator+=
            ((string *)local_78,
             (string *)
             &opts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &opts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  psVar2 = linkLanguage_local;
  pcVar1 = this->LocalGenerator;
  pcVar3 = cmGeneratorTarget::GetProperty
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)local_78);
  (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
            (pcVar1,psVar2,pcVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_b8);
  cmGeneratorTarget::GetLinkOptions
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b8,&(this->super_cmCommonTargetGenerator).ConfigName,local_20);
  cmLocalGenerator::AppendCompileOptions
            ((cmLocalGenerator *)this->LocalGenerator,linkLanguage_local,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b8,(char *)0x0);
  cmLocalGenerator::AppendPositionIndependentLinkerFlags
            ((cmLocalGenerator *)this->LocalGenerator,linkLanguage_local,
             (this->super_cmCommonTargetGenerator).GeneratorTarget,
             &(this->super_cmCommonTargetGenerator).ConfigName,local_20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b8);
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void cmMakefileTargetGenerator::GetTargetLinkFlags(
  std::string& flags, const std::string& linkLanguage)
{
  this->LocalGenerator->AppendFlags(
    flags, this->GeneratorTarget->GetProperty("LINK_FLAGS"));

  std::string linkFlagsConfig = "LINK_FLAGS_";
  linkFlagsConfig += cmSystemTools::UpperCase(this->ConfigName);
  this->LocalGenerator->AppendFlags(
    flags, this->GeneratorTarget->GetProperty(linkFlagsConfig));

  std::vector<std::string> opts;
  this->GeneratorTarget->GetLinkOptions(opts, this->ConfigName, linkLanguage);
  // LINK_OPTIONS are escaped.
  this->LocalGenerator->AppendCompileOptions(flags, opts);

  this->LocalGenerator->AppendPositionIndependentLinkerFlags(
    flags, this->GeneratorTarget, this->ConfigName, linkLanguage);
}